

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<int>::FindNEQ
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          BpTree<int> *this,int k)

{
  bool bVar1;
  reference __x;
  _Self local_78;
  _Base_ptr local_70;
  _Rb_tree_const_iterator<Addr> local_68;
  iterator it;
  undefined1 local_50 [8];
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> s2;
  int k_local;
  BpTree<int> *this_local;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *s1;
  
  s2._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
  s2._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = k;
  FindGreater(__return_storage_ptr__,this,k,false);
  FindLess((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)local_50,this,
           s2._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,false);
  std::_Rb_tree_const_iterator<Addr>::_Rb_tree_const_iterator(&local_68);
  local_70 = (_Base_ptr)
             std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::begin
                       ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)local_50);
  local_68._M_node = local_70;
  while( true ) {
    local_78._M_node =
         (_Base_ptr)
         std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::end
                   ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)local_50);
    bVar1 = std::operator!=(&local_68,&local_78);
    if (!bVar1) break;
    __x = std::_Rb_tree_const_iterator<Addr>::operator*(&local_68);
    std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::insert(__return_storage_ptr__,__x);
    std::_Rb_tree_const_iterator<Addr>::operator++(&local_68,0);
  }
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::clear
            ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)local_50);
  s2._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set
            ((set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)local_50);
  if ((s2._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ & 1) == 0) {
    std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::~set(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

set<Addr> BpTree<K>::FindNEQ(K k) {
	set<Addr> s1 = this->FindGreater(k, false);
	set<Addr> s2 = this->FindLess(k, false);
	set<Addr>::iterator it;
	for (it = s2.begin(); it != s2.end(); it++) {
		s1.insert(*it);
	}
	s2.clear();
	return s1;
}